

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QRect __thiscall QDockAreaLayoutInfo::itemRect(QDockAreaLayoutInfo *this,int index,bool isGap)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  quintptr qVar4;
  quintptr qVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  QDockAreaLayoutItem *this_00;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  QRect QVar13;
  QRect QVar14;
  undefined4 extraout_var;
  
  lVar12 = (long)index;
  this_00 = (this->item_list).d.ptr + lVar12;
  bVar3 = QDockAreaLayoutItem::skip(this_00);
  QVar13 = (QRect)(ZEXT816(0xffffffff) << 0x40);
  if (bVar3) {
    uVar9 = 0;
    uVar6 = 0xffffffff;
    QVar13 = (QRect)(ZEXT816(0xffffffff) << 0x40);
    goto LAB_003ef3c9;
  }
  if (isGap) {
    uVar9 = 0;
    uVar6 = 0xffffffff;
    if ((this_00->flags & 1) == 0) goto LAB_003ef3c9;
    if (this->tabbed != false) goto LAB_003ef3b0;
    uVar1 = this_00->pos;
    uVar9 = (ulong)uVar1;
    iVar7 = this_00->size;
    iVar11 = index;
    uVar8 = index;
    do {
      uVar8 = uVar8 - 1;
      if (iVar11 < 1) {
        iVar11 = -1;
        break;
      }
      bVar3 = QDockAreaLayoutItem::skip((this->item_list).d.ptr + uVar8);
      iVar11 = iVar11 + -1;
    } while (bVar3);
    lVar2 = lVar12 * 0x28;
    do {
      lVar12 = lVar12 + 1;
      if ((this->item_list).d.size <= lVar12) {
        index = -1;
        break;
      }
      bVar3 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->item_list).d.ptr[1].widgetItem + lVar2));
      index = index + 1;
      lVar2 = lVar2 + 0x28;
    } while (bVar3);
    if ((iVar11 != -1) && (((this->item_list).d.ptr[iVar11].flags & 1) == 0)) {
      uVar9 = (ulong)(uVar1 + *this->sep);
      iVar7 = iVar7 - *this->sep;
    }
    if ((index != -1) && (((this->item_list).d.ptr[index].flags & 1) == 0)) {
      iVar7 = iVar7 - *this->sep;
    }
  }
  else {
    if (this->tabbed != false) {
      if (this_00->widgetItem == (QLayoutItem *)0x0) {
        qVar4 = 0;
      }
      else {
        iVar7 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
        qVar4 = CONCAT44(extraout_var,iVar7);
      }
      qVar5 = currentTabId(this);
      uVar9 = 0;
      uVar6 = 0xffffffff;
      QVar13 = (QRect)(ZEXT816(0xffffffff) << 0x40);
      if (qVar4 != qVar5) goto LAB_003ef3c9;
LAB_003ef3b0:
      QVar13 = tabContentRect(this);
      uVar9 = QVar13._0_8_ >> 0x20;
      uVar6 = QVar13._8_8_ >> 0x20;
      goto LAB_003ef3c9;
    }
    uVar9 = (ulong)(uint)this_00->pos;
    iVar7 = this_00->size;
  }
  uVar6._0_4_ = (this->rect).x1;
  uVar6._4_4_ = (this->rect).y1;
  if (this->o == Vertical) {
    iVar11 = ((this->rect).x2.m_i - (undefined4)uVar6) + 1;
    uVar10 = uVar6 & 0xffffffff;
  }
  else {
    uVar10 = uVar9;
    iVar11 = iVar7;
    if (this->o != Horizontal) {
      iVar11 = -1;
      uVar10 = 0;
    }
    uVar9 = uVar6 >> 0x20;
    iVar7 = ((this->rect).y2.m_i - uVar6._4_4_) + 1;
  }
  QVar13.x2.m_i = (int)uVar10 + iVar11 + -1;
  QVar13.x1.m_i = (int)uVar10;
  QVar13.y1.m_i = (int)(uVar10 >> 0x20);
  QVar13.y2.m_i = 0;
  uVar6 = (ulong)((iVar7 + (int)uVar9) - 1);
LAB_003ef3c9:
  QVar14._0_8_ = QVar13._0_8_ & 0xffffffff | uVar9 << 0x20;
  QVar14._8_8_ = QVar13._8_8_ & 0xffffffff | uVar6 << 0x20;
  return QVar14;
}

Assistant:

QRect QDockAreaLayoutInfo::itemRect(int index, bool isGap) const
{
    const QDockAreaLayoutItem &item = item_list.at(index);

    if (item.skip())
        return QRect();

    if (isGap && !(item.flags & QDockAreaLayoutItem::GapItem))
        return QRect();

    QRect result;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        if (isGap || tabId(item) == currentTabId())
            result = tabContentRect();
    } else
#endif
    {
        int pos = item.pos;
        int size = item.size;

        if (isGap) {
            int prev = this->prev(index);
            int next = this->next(index);
            if (prev != -1 && !(item_list.at(prev).flags & QDockAreaLayoutItem::GapItem)) {
                pos += *sep;
                size -= *sep;
            }
            if (next != -1 && !(item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
                size -= *sep;
        }

        QPoint p;
        rpick(o, p) = pos;
        rperp(o, p) = perp(o, rect.topLeft());
        QSize s;
        rpick(o, s) = size;
        rperp(o, s) = perp(o, rect.size());
        result = QRect(p, s);
    }

    return result;
}